

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepEdge>>::
load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepEdge>> *this,
          long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  handle hVar1;
  long lVar2;
  bool bVar3;
  undefined8 in_RAX;
  long lVar4;
  reference rVar5;
  undefined8 uStack_38;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  uStack_38 = in_RAX;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x30),hVar1,(*rVar5._M_p & rVar5._M_mask) != 0);
  uStack_38._0_6_ = CONCAT15(bVar3,(undefined5)uStack_38);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar3 = type_caster<unsigned_long,_void>::load
                    ((type_caster<unsigned_long,_void> *)(this + 0x28),hVar1,
                     (*rVar5._M_p & rVar5._M_mask) != 0);
  uStack_38._0_7_ = CONCAT16(bVar3,(undefined6)uStack_38);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  type_caster_generic::
  load_impl<pybind11::detail::copyable_holder_caster<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>>
            ((type_caster_generic *)this,hVar1,(*rVar5._M_p & rVar5._M_mask) != 0);
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar4 == 3) break;
    lVar2 = lVar4 + 1;
  } while (*(char *)((long)&uStack_38 + lVar4 + 5) != '\0');
  return lVar4 == 3;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }